

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::LoopBodyStart<false,true>
          (InterpreterStackFrame *this,uint32 loopNumber,LayoutSize layoutSize,bool isFirstIteration
          )

{
  if (*(char *)(*(long *)(this + 0x78) + 0x143f) == '\x01') {
    TTD::ExecutionInfoManager::UpdateLoopCountInfo
              (*(ExecutionInfoManager **)(*(long *)(*(long *)(this + 0x78) + 0x3b8) + 0x16b0));
  }
  if (((byte)this[0xd4] & 6) != 0) {
    return;
  }
  DoLoopBodyStart(this,loopNumber,layoutSize,true,isFirstIteration);
  return;
}

Assistant:

void InterpreterStackFrame::LoopBodyStart(uint32 loopNumber, LayoutSize layoutSize, bool isFirstIteration)
    {
        if (InterruptProbe)
        {
            this->DoInterruptProbe();
        }

#if ENABLE_TTD
        if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
        {
            this->scriptContext->GetThreadContext()->TTDExecutionInfo->UpdateLoopCountInfo();
        }
#endif

        if (!JITLoopBody || this->IsInCatchOrFinallyBlock())
        {
            // For functions having try-catch-finally, jit loop bodies for loops that are contained only in a try block,
            // not even indirect containment in a Catch or Finally.
            return;
        }

        DoLoopBodyStart(loopNumber, layoutSize, true, isFirstIteration);
    }